

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O2

void explicit_suite::run(void)

{
  visit_null();
  visit_boolean();
  visit_integer();
  visit_real();
  visit_string();
  visit_array();
  visit_map();
  return;
}

Assistant:

void run()
{
    visit_null();
    visit_boolean();
    visit_integer();
    visit_real();
    visit_string();
    visit_array();
    visit_map();
}